

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O2

void generateNative<false>(uint32_t nonce)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint64_t hash [8];
  uint8_t blockTemplate [76];
  Program prog;
  uint8_t scratchpad [2097152];
  
  puVar2 = blockTemplate_;
  puVar3 = blockTemplate;
  for (lVar1 = 0x4c; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  blockTemplate._39_4_ = nonce;
  randomx_blake2b(hash,0x40,blockTemplate,0x4c,(void *)0x0,0);
  fillAes1Rx4<false>(hash,0x200000,scratchpad);
  fillAes4Rx4<false>(hash,0xa80,&prog);
  randomx::Program::print(&prog,(ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void generateNative(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[randomx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, randomx::ScratchpadSize, scratchpad);
	alignas(16) randomx::Program prog;
	fillAes4Rx4<softAes>((void*)hash, sizeof(prog), &prog);
	std::cout << prog << std::endl;
}